

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_readwrite.c
# Opt level: O3

void canvas_savetofile(_glist *x,t_symbol *filename,t_symbol *dir,float fdestroy)

{
  t_dataslot *ptVar1;
  undefined8 uVar2;
  char *pcVar3;
  t_symbol **fatso;
  int iVar4;
  _binbuf *x_00;
  long lVar5;
  t_template *ptVar6;
  t_symbol *ptVar7;
  t_symbol *ptVar8;
  int *piVar9;
  char *pcVar10;
  int in_ECX;
  long lVar11;
  char *pcVar12;
  long lVar13;
  int ntemplates;
  t_symbol **templatevec;
  int local_3c;
  t_symbol **local_38;
  
  x_00 = binbuf_new();
  local_38 = (t_symbol **)getbytes(0);
  local_3c = 0;
  canvas_collecttemplatesfor(x,&local_3c,&local_38,in_ECX);
  fatso = local_38;
  lVar5 = (long)local_3c;
  if (0 < lVar5) {
    lVar11 = 0;
    do {
      ptVar6 = template_findbyname(fatso[lVar11]);
      if (ptVar6 == (t_template *)0x0) {
        bug("canvas_savetemplatesto");
      }
      else {
        iVar4 = ptVar6->t_n;
        ptVar7 = gensym("struct");
        ptVar8 = gensym(fatso[lVar11]->s_name + 3);
        binbuf_addv(x_00,"sss",&s__N,ptVar7,ptVar8);
        if (0 < (long)iVar4) {
          lVar13 = 0;
          do {
            ptVar7 = &s_float;
            switch(*(undefined4 *)((long)&ptVar6->t_vec->ds_type + lVar13)) {
            case 0:
              break;
            case 1:
              ptVar7 = &s_symbol;
              break;
            case 2:
              pcVar12 = "text";
              goto LAB_00151f89;
            case 3:
              pcVar12 = "array";
LAB_00151f89:
              ptVar7 = gensym(pcVar12);
              break;
            default:
              bug("canvas_write");
              ptVar7 = &s_float;
            }
            ptVar1 = ptVar6->t_vec;
            uVar2 = *(undefined8 *)((long)&ptVar1->ds_name + lVar13);
            if (*(int *)((long)&ptVar1->ds_type + lVar13) == 3) {
              ptVar8 = gensym((char *)(**(long **)((long)&ptVar1->ds_arraytemplate + lVar13) + 3));
              binbuf_addv(x_00,"sss",ptVar7,uVar2,ptVar8);
            }
            else {
              binbuf_addv(x_00,"ss",ptVar7);
            }
            lVar13 = lVar13 + 0x18;
          } while ((long)iVar4 * 0x18 != lVar13);
        }
        binbuf_addsemi(x_00);
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 != lVar5);
  }
  freebytes(fatso,lVar5 << 3);
  canvas_saveto(x,x_00);
  piVar9 = __errno_location();
  *piVar9 = 0;
  iVar4 = binbuf_write(x_00,filename->s_name,dir->s_name,0);
  if (iVar4 == 0) {
    if (x->gl_owner == (_glist *)0x0) {
      canvas_rename(x,filename,dir);
      canvas_updatewindowlist();
    }
    post("saved to: %s/%s",dir->s_name,filename->s_name);
    canvas_dirty(x,0.0);
    canvas_reload(filename,dir,x);
    if ((fdestroy != 0.0) || (NAN(fdestroy))) {
      ptVar7 = gensym("menuclose");
      pd_vmess((t_pd *)x,ptVar7,"f",0x3ff0000000000000);
    }
  }
  else {
    pcVar12 = dir->s_name;
    pcVar3 = filename->s_name;
    if (*piVar9 == 0) {
      pcVar10 = "write failed";
    }
    else {
      pcVar10 = strerror(*piVar9);
    }
    post("%s/%s: %s",pcVar12,pcVar3,pcVar10);
  }
  binbuf_free(x_00);
  return;
}

Assistant:

static void canvas_savetofile(t_canvas *x, t_symbol *filename, t_symbol *dir,
    float fdestroy)
{
    t_binbuf *b = binbuf_new();
    canvas_savetemplatesto(x, b, 1);
    canvas_saveto(x, b);
    errno = 0;
    if (binbuf_write(b, filename->s_name, dir->s_name, 0))
        post("%s/%s: %s", dir->s_name, filename->s_name,
            (errno ? strerror(errno) : "write failed"));
    else
    {
            /* if not an abstraction, reset title bar and directory */
        if (!x->gl_owner)
{
            canvas_rename(x, filename, dir);
            /* update window list in case Save As changed the window name */
            canvas_updatewindowlist();
}
        post("saved to: %s/%s", dir->s_name, filename->s_name);
        canvas_dirty(x, 0);
        canvas_reload(filename, dir, x);
        if (fdestroy != 0)
            vmess(&x->gl_pd, gensym("menuclose"), "f", 1.);
    }
    binbuf_free(b);
}